

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  lha *lha;
  char cVar2;
  uint16_t uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  ushort *pp;
  short *pp_00;
  byte *pbVar10;
  time_t tVar11;
  size_t sVar12;
  mode_t mVar13;
  ulong uVar14;
  long lVar15;
  ushort uVar16;
  int iVar17;
  void *pvVar18;
  uint uVar19;
  ulong uVar20;
  archive_string_conv *sc;
  byte bVar21;
  void *h;
  bool bVar22;
  uint16_t header_crc;
  wchar_t *conv_buffer_p;
  size_t extdsize;
  archive_wstring local_d8;
  archive_wstring local_b8;
  wchar_t *local_a0;
  archive_mstring local_98;
  
  if (lha_crc16_init_crc16init == '\0') {
    lha_crc16_init_crc16init = '\x01';
    uVar14 = 0;
    do {
      iVar17 = -8;
      uVar20 = uVar14 & 0xffffffff;
      do {
        uVar19 = 0;
        if ((uVar20 & 1) != 0) {
          uVar19 = 0xa001;
        }
        uVar19 = uVar19 ^ (uint)(uVar20 >> 1) & 0x7fff;
        uVar20 = (ulong)uVar19;
        iVar17 = iVar17 + 1;
      } while (iVar17 != 0);
      crc16tbl[0][uVar14] = (uint16_t)uVar19;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x100);
    lVar15 = -0x200;
    do {
      uVar16 = *(ushort *)((long)crc16tbl[1] + lVar15);
      *(ushort *)((long)&archive_read_format_tar_read_header::default_inode + lVar15) =
           uVar16 >> 8 ^ crc16tbl[0][(byte)uVar16];
      lVar15 = lVar15 + 2;
    } while (lVar15 != 0);
  }
  (a->archive).archive_format = 0xb0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "lha";
  }
  lha = (lha *)a->format->data;
  lha->decompress_init = '\0';
  lha->end_of_entry = '\0';
  lha->end_of_entry_cleanup = '\0';
  lha->entry_unconsumed = 0;
  pcVar6 = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (pcVar6 == (char *)0x0) {
      return L'\x01';
    }
    if (*pcVar6 == '\0') {
      return L'\x01';
    }
    goto LAB_001492a0;
  }
  if (lha->found_first_header == '\0') {
    cVar2 = *pcVar6;
    if (cVar2 != 'M') goto LAB_00149258;
    if (pcVar6[1] != 'Z') goto LAB_00149254;
    uVar14 = 0x1000;
    do {
      while (pvVar8 = __archive_read_ahead(a,uVar14,(ssize_t *)&local_98), pvVar8 != (void *)0x0) {
        if ((long)local_98.aes_mbs.s < 0x16) goto LAB_00149349;
        pvVar18 = pvVar8;
        if (local_98.aes_mbs.s != (char *)0x16) {
          pcVar6 = local_98.aes_mbs.s + (long)pvVar8;
          h = pvVar8;
          do {
            sVar7 = lha_check_header_format(h);
            if (sVar7 == 0) {
              __archive_read_consume(a,(long)h - (long)pvVar8);
              pcVar6 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
              if (pcVar6 == (char *)0x0) goto LAB_001492a0;
              goto LAB_00149254;
            }
            pvVar18 = (void *)((long)h + sVar7);
            pcVar9 = (char *)((long)h + sVar7 + 0x16);
            h = pvVar18;
          } while (pcVar9 < pcVar6);
        }
        __archive_read_consume(a,(long)pvVar18 - (long)pvVar8);
      }
      bVar22 = 0x31 < uVar14;
      uVar14 = uVar14 >> 1;
    } while (bVar22);
LAB_00149349:
    pcVar6 = "Couldn\'t find out LHa header";
  }
  else {
LAB_00149254:
    cVar2 = *pcVar6;
LAB_00149258:
    if (cVar2 == '\0') {
      return L'\x01';
    }
    sVar7 = lha_check_header_format(pcVar6);
    if (sVar7 != 0) {
      pcVar6 = "Bad LHa file";
      goto LAB_001492a7;
    }
    lha->found_first_header = '\x01';
    lha->header_size = 0;
    lha->level = pcVar6[0x14];
    lha->method[0] = pcVar6[3];
    lha->method[1] = pcVar6[4];
    cVar2 = pcVar6[5];
    lha->method[2] = cVar2;
    uVar16 = *(ushort *)lha->method ^ 0x686c;
    lha->directory = cVar2 == 'd' && uVar16 == 0;
    if (cVar2 == '0' && uVar16 == 0) {
      bVar22 = false;
    }
    else {
      bVar22 = lha->method[2] != '4' || *(short *)lha->method != 0x7a6c;
    }
    lha->entry_is_compressed = bVar22;
    mVar13 = 0x1b6;
    if (cVar2 == 'd' && uVar16 == 0) {
      mVar13 = 0x1ff;
    }
    lha->compsize = 0;
    lha->origsize = 0;
    lha->setflag = 0;
    lha->birthtime = 0;
    lha->birthtime_tv_nsec = 0;
    lha->mtime = 0;
    lha->mtime_tv_nsec = 0;
    lha->atime = 0;
    lha->atime_tv_nsec = 0;
    lha->mode = mVar13;
    (lha->dirname).length = 0;
    (lha->filename).length = 0;
    lha->dos_attr = '\0';
    lha->uid = 0;
    lha->gid = 0;
    lha->sconv_dir = lha->opt_sconv;
    lha->sconv_fname = lha->opt_sconv;
    if (3 < (byte)pcVar6[0x14]) {
      archive_set_error(&a->archive,0x54,"Unsupported LHa header level %d");
      return L'\xffffffe2';
    }
    switch(pcVar6[0x14]) {
    case '\0':
      pbVar10 = (byte *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
      if (pbVar10 != (byte *)0x0) {
        lha->header_size = (ulong)*pbVar10 + 2;
        bVar1 = pbVar10[1];
        lha->compsize = (ulong)*(uint *)(pbVar10 + 7);
        lha->origsize = (ulong)*(uint *)(pbVar10 + 0xb);
        tVar11 = lha_dos_time(pbVar10 + 0xf);
        lha->mtime = tVar11;
        bVar21 = pbVar10[0x15];
        uVar14 = (ulong)bVar21;
        iVar17 = ((int)lha->header_size - (uint)bVar21) + -0x18;
        if (iVar17 != -2 && (iVar17 < 0 || 0xdd < bVar21)) {
          pcVar6 = "Invalid LHa header";
          goto LAB_001492a7;
        }
        pvVar8 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
        if (pvVar8 == (void *)0x0) goto LAB_001492a0;
        (lha->filename).length = 0;
        archive_strncat(&lha->filename,(void *)((long)pvVar8 + 0x16),uVar14);
        if (-1 < iVar17) {
          lha->crc = *(uint16_t *)((long)pvVar8 + 0x16 + uVar14);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
        }
        sVar7 = lha->header_size;
        if (sVar7 == 2) {
          bVar21 = 0;
        }
        else {
          sVar12 = 2;
          bVar21 = 0;
          do {
            bVar21 = bVar21 + *(char *)((long)pvVar8 + sVar12);
            sVar12 = sVar12 + 1;
          } while (sVar7 != sVar12);
        }
        if (((0 < iVar17) && (*(char *)((long)pvVar8 + uVar14 + 0x18) == 'U')) && (iVar17 == 0xc)) {
          lha->mtime = (ulong)*(uint *)((long)pvVar8 + uVar14 + 0x1a);
          lha->mode = (uint)*(ushort *)((long)pvVar8 + uVar14 + 0x1e);
          lha->uid = (ulong)*(ushort *)((long)pvVar8 + uVar14 + 0x20);
          lha->gid = (ulong)*(ushort *)((long)pvVar8 + uVar14 + 0x22);
          *(byte *)&lha->setflag = (byte)lha->setflag | 4;
        }
        __archive_read_consume(a,sVar7);
        wVar4 = L'\0';
        if (bVar21 != bVar1) {
          pcVar6 = "LHa header sum error";
          iVar17 = -1;
          goto LAB_001492af;
        }
        goto LAB_001499ce;
      }
      goto LAB_001492a0;
    case '\x01':
      pbVar10 = (byte *)__archive_read_ahead(a,0x1b,(ssize_t *)0x0);
      if (pbVar10 == (byte *)0x0) {
LAB_00149752:
        pcVar9 = "Truncated LHa header";
        goto LAB_001499b1;
      }
      lha->header_size = (ulong)*pbVar10 + 2;
      bVar1 = pbVar10[1];
      lha->compsize = (ulong)*(uint *)(pbVar10 + 7);
      lha->origsize = (ulong)*(uint *)(pbVar10 + 0xb);
      tVar11 = lha_dos_time(pbVar10 + 0xf);
      lha->mtime = tVar11;
      bVar21 = pbVar10[0x15];
      sVar7 = (size_t)bVar21;
      if ((0xe6 < bVar21) || ((int)lha->header_size + -0x1b < (int)(uint)bVar21)) {
LAB_001499aa:
        pcVar9 = "Invalid LHa header";
        goto LAB_001499b1;
      }
      pvVar8 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
      if (pvVar8 == (void *)0x0) goto LAB_00149752;
      pvVar18 = (void *)((long)pvVar8 + 0x16);
      if (sVar7 == 0) {
        sVar7 = 0;
      }
      else {
        uVar14 = 0;
        do {
          if (*(char *)((long)pvVar18 + uVar14) == -1) goto LAB_001499aa;
          uVar14 = uVar14 + 1;
        } while (sVar7 != uVar14);
      }
      (lha->filename).length = 0;
      archive_strncat(&lha->filename,pvVar18,sVar7);
      lha->crc = *(uint16_t *)((long)pvVar18 + sVar7);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
      lVar15 = lha->header_size - 2;
      if (lVar15 == 0) {
        bVar21 = 0;
      }
      else {
        sVar7 = 2;
        bVar21 = 0;
        do {
          bVar21 = bVar21 + *(char *)((long)pvVar8 + sVar7);
          sVar7 = sVar7 + 1;
        } while (lha->header_size != sVar7);
      }
      __archive_read_consume(a,lVar15);
      wVar4 = lha_read_file_extended_header
                        (a,lha,(uint16_t *)0x0,L'\x02',lha->compsize + 2,(size_t *)&local_98);
      if (L'\xffffffeb' < wVar4) {
        lVar15 = (lha->compsize - (long)local_98.aes_mbs.s) + 2;
        lha->compsize = lVar15;
        if (lVar15 < 0) goto LAB_001499aa;
        if (bVar21 != bVar1) {
          pcVar9 = "LHa header sum error";
          iVar17 = -1;
          break;
        }
        wVar4 = wVar4 & wVar4 >> 0x1f;
      }
      goto LAB_001499c5;
    case '\x02':
      pp = (ushort *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
      pcVar9 = "Truncated LHa header";
      if (pp != (ushort *)0x0) {
        uVar16 = *pp;
        lha->header_size = (ulong)uVar16;
        lha->compsize = (ulong)*(uint *)((long)pp + 7);
        lha->origsize = (ulong)*(uint *)((long)pp + 0xb);
        lha->mtime = (ulong)*(uint *)((long)pp + 0xf);
        lha->crc = *(uint16_t *)((long)pp + 0x15);
        *(byte *)&lha->setflag = (byte)lha->setflag | 8;
        if ((ulong)uVar16 < 0x18) {
          pcVar9 = "Invalid LHa header size";
        }
        else {
          uVar3 = lha_crc16(0,pp,0x18);
          local_d8.s = (wchar_t *)CONCAT62(local_d8.s._2_6_,uVar3);
          __archive_read_consume(a,0x18);
          wVar4 = lha_read_file_extended_header
                            (a,lha,(uint16_t *)&local_d8,L'\x02',lha->header_size - 0x18,
                             (size_t *)&local_98);
          if (wVar4 < L'\xffffffec') goto LAB_001499c5;
          uVar19 = ((int)lha->header_size - (int)local_98.aes_mbs.s) - 0x18;
          if (0 < (int)uVar19) {
            uVar14 = (ulong)uVar19;
            pvVar8 = __archive_read_ahead(a,uVar14,(ssize_t *)0x0);
            if (pvVar8 == (void *)0x0) goto LAB_001495a0;
            uVar3 = lha_crc16((uint16_t)local_d8.s,pvVar8,uVar14);
            local_d8.s = (wchar_t *)CONCAT62(local_d8.s._2_6_,uVar3);
            __archive_read_consume(a,uVar14);
          }
          if ((uint16_t)local_d8.s == lha->header_crc) goto LAB_001499c5;
          pcVar9 = "LHa header CRC error";
        }
      }
LAB_001495a0:
      iVar17 = 0x54;
      break;
    case '\x03':
      pp_00 = (short *)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
      if (pp_00 == (short *)0x0) goto LAB_00149752;
      pcVar9 = "Invalid LHa header";
      if (*pp_00 == 4) {
        uVar19 = *(uint *)(pp_00 + 0xc);
        lha->header_size = (ulong)uVar19;
        lha->compsize = (ulong)*(uint *)((long)pp_00 + 7);
        lha->origsize = (ulong)*(uint *)((long)pp_00 + 0xb);
        lha->mtime = (ulong)*(uint *)((long)pp_00 + 0xf);
        uVar3 = *(uint16_t *)((long)pp_00 + 0x15);
        *(byte *)&lha->setflag = (byte)lha->setflag | 8;
        lha->crc = uVar3;
        if (0x1f < (ulong)uVar19) {
          uVar3 = lha_crc16(0,pp_00,0x1c);
          local_d8.s = (wchar_t *)CONCAT62(local_d8.s._2_6_,uVar3);
          __archive_read_consume(a,0x1c);
          wVar4 = lha_read_file_extended_header
                            (a,lha,(uint16_t *)&local_d8,L'\x04',lha->header_size - 0x1c,
                             (size_t *)&local_98);
          if ((wVar4 < L'\xffffffec') || ((uint16_t)local_d8.s == lha->header_crc))
          goto LAB_001499c5;
          pcVar9 = "LHa header CRC error";
        }
      }
LAB_001499b1:
      iVar17 = 0x54;
    }
    archive_set_error(&a->archive,iVar17,pcVar9);
    wVar4 = L'\xffffffe2';
LAB_001499c5:
    if (wVar4 < L'\xffffffec') {
      return wVar4;
    }
LAB_001499ce:
    if ((lha->directory != '\0') || ((lha->filename).length != 0)) {
      local_b8.s = (wchar_t *)0x0;
      local_b8.length = 0;
      local_b8.buffer_length = 0;
      local_d8.s = (wchar_t *)0x0;
      local_d8.length = 0;
      local_d8.buffer_length = 0;
      local_98.aes_mbs.s = (char *)0x0;
      local_98.aes_mbs.length = 0;
      local_98.aes_mbs.buffer_length = 0;
      local_98.aes_utf8.s = (char *)0x0;
      local_98.aes_utf8.length = 0;
      local_98.aes_utf8.buffer_length = 0;
      local_98.aes_wcs.s = (wchar_t *)0x0;
      local_98.aes_wcs.length = 0;
      local_98.aes_wcs.buffer_length = 0;
      local_98.aes_mbs_in_locale.s = (char *)0x0;
      local_98.aes_mbs_in_locale.length = 0;
      local_98.aes_mbs_in_locale.buffer_length = 0;
      wVar5 = archive_mstring_copy_mbs_len_l
                        (&local_98,(lha->dirname).s,(lha->dirname).length,lha->sconv_dir);
      if (wVar5 == L'\0') {
        wVar5 = archive_mstring_get_wcs(&a->archive,&local_98,&local_a0);
        if (wVar5 != L'\0') goto LAB_00149a76;
        local_b8.length = 0;
        archive_wstring_concat(&local_b8,&local_98.aes_wcs);
        local_98.aes_mbs.length = 0;
        local_98.aes_mbs_in_locale.length = 0;
        local_98.aes_utf8.length = 0;
        local_98.aes_wcs.length = 0;
        wVar5 = archive_mstring_copy_mbs_len_l
                          (&local_98,(lha->filename).s,(lha->filename).length,lha->sconv_fname);
        if (wVar5 == L'\0') {
          wVar5 = archive_mstring_get_wcs(&a->archive,&local_98,&local_a0);
          if (wVar5 != L'\0') goto LAB_00149a76;
          archive_wstring_concat(&local_b8,&local_98.aes_wcs);
          archive_mstring_clean(&local_98);
          if ((lha->mode & 0xf000) == 0xa000) {
            wVar5 = lha_parse_linkname(&local_d8,&local_b8);
            if (wVar5 == L'\0') {
              archive_set_error(&a->archive,0x54,"Unknown symlink-name");
              archive_wstring_free(&local_b8);
              archive_wstring_free(&local_d8);
              return L'\xffffffe7';
            }
          }
          else {
            lha->mode = (lha->mode & 0xffff0fff) + (uint)(lha->directory == '\0') * 0x4000 + 0x4000;
          }
          if (((lha->setflag & 4) == 0) && ((lha->dos_attr & 1) != 0)) {
            *(byte *)&lha->mode = (byte)lha->mode & 0x6d;
          }
          archive_entry_copy_pathname_w(entry,local_b8.s);
          archive_wstring_free(&local_b8);
          if (local_d8.length == 0) {
            archive_entry_set_symlink(entry,(char *)0x0);
          }
          else {
            archive_entry_copy_symlink_w(entry,local_d8.s);
          }
          archive_wstring_free(&local_d8);
          if (pcVar6[0x14] == '\0') {
            lha_replace_path_separator(lha,entry);
          }
          archive_entry_set_mode(entry,lha->mode);
          archive_entry_set_uid(entry,lha->uid);
          archive_entry_set_gid(entry,lha->gid);
          if ((lha->uname).length != 0) {
            archive_entry_set_uname(entry,(lha->uname).s);
          }
          if ((lha->gname).length != 0) {
            archive_entry_set_gname(entry,(lha->gname).s);
          }
          if ((lha->setflag & 1) == 0) {
            archive_entry_unset_birthtime(entry);
            archive_entry_unset_ctime(entry);
          }
          else {
            archive_entry_set_birthtime(entry,lha->birthtime,lha->birthtime_tv_nsec);
            archive_entry_set_ctime(entry,lha->birthtime,lha->birthtime_tv_nsec);
          }
          archive_entry_set_mtime(entry,lha->mtime,lha->mtime_tv_nsec);
          if ((lha->setflag & 2) == 0) {
            archive_entry_unset_atime(entry);
          }
          else {
            archive_entry_set_atime(entry,lha->atime,lha->atime_tv_nsec);
          }
          if ((lha->directory == '\0') &&
             (pcVar6 = archive_entry_symlink(entry), pcVar6 == (char *)0x0)) {
            archive_entry_set_size(entry,lha->origsize);
          }
          else {
            archive_entry_unset_size(entry);
          }
          lVar15 = lha->compsize;
          lha->entry_bytes_remaining = lVar15;
          if (-1 < lVar15) {
            lha->entry_offset = 0;
            lha->entry_crc_calculated = 0;
            if ((lVar15 == 0) || (lha->directory != '\0')) {
              lha->end_of_entry = '\x01';
            }
            snprintf(lha->format_name,0x40,"lha -%c%c%c-",(ulong)(uint)(int)lha->method[0],
                     (ulong)(uint)(int)lha->method[1],(ulong)(uint)(int)lha->method[2]);
            (a->archive).archive_format_name = lha->format_name;
            return wVar4;
          }
          pcVar6 = "Invalid LHa entry size";
          goto LAB_001492a7;
        }
        sc = lha->sconv_fname;
      }
      else {
        sc = lha->sconv_dir;
      }
      pcVar6 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to Unicode.",pcVar6);
LAB_00149a76:
      archive_mstring_clean(&local_98);
      archive_wstring_free(&local_b8);
      archive_wstring_free(&local_d8);
      return L'\xffffffe2';
    }
LAB_001492a0:
    pcVar6 = "Truncated LHa header";
  }
LAB_001492a7:
  iVar17 = 0x54;
LAB_001492af:
  archive_set_error(&a->archive,iVar17,pcVar6);
  return L'\xffffffe2';
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_wstring linkname;
	struct archive_wstring pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	struct archive_mstring conv_buffer;
	const wchar_t *conv_buffer_p;

	lha_crc16_init();

	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL) {
		lha->sconv_dir = lha->opt_sconv;
		lha->sconv_fname = lha->opt_sconv;
	} else {
		lha->sconv_dir = NULL;
		lha->sconv_fname = NULL;
	}

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename, after converting to Unicode.
	 * This is because codepages might differ between dirname and filename.
	*/
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_init(&conv_buffer.aes_mbs);
	archive_string_init(&conv_buffer.aes_mbs_in_locale);
	archive_string_init(&conv_buffer.aes_utf8);
	archive_string_init(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->dirname.s, lha->dirname.length, lha->sconv_dir)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_dir));
		err = ARCHIVE_FATAL;
	} else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_copy(&pathname, &conv_buffer.aes_wcs);

	archive_string_empty(&conv_buffer.aes_mbs);
	archive_string_empty(&conv_buffer.aes_mbs_in_locale);
	archive_string_empty(&conv_buffer.aes_utf8);
	archive_wstring_empty(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->filename.s, lha->filename.length, lha->sconv_fname)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_fname));
		err = ARCHIVE_FATAL;
	}
	else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_concat(&pathname, &conv_buffer.aes_wcs);
	archive_mstring_clean(&conv_buffer);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_wstring_free(&pathname);
			archive_wstring_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	archive_entry_copy_pathname_w(entry, pathname.s);
	archive_wstring_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		archive_entry_copy_symlink_w(entry, linkname.s);
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_wstring_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	if (lha->entry_bytes_remaining < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa entry size");
		return (ARCHIVE_FATAL);
	}
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	snprintf(lha->format_name, sizeof(lha->format_name), "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}